

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O1

int32 limit_xm_getnc(char *ptr,int32 n,void *f)

{
  long lVar1;
  size_t __n;
  uint uVar2;
  size_t __n_00;
  
  lVar1 = *(long *)((long)f + 8);
  uVar2 = (int)*(undefined8 *)((long)f + 0x18) - (int)lVar1;
  __n_00 = (size_t)n;
  if (n - uVar2 == 0 || n < (int)uVar2) {
    memcpy(ptr,(void *)(lVar1 + *f),__n_00);
  }
  else {
    __n = __n_00;
    if (0 < (int)uVar2) {
      memcpy(ptr,(void *)(lVar1 + *f),(ulong)(uVar2 & 0x7fffffff));
      ptr = ptr + (uVar2 & 0x7fffffff);
      __n = (long)(int)(n - uVar2);
    }
    memset(ptr,0,__n);
  }
  *(long *)((long)f + 8) = *(long *)((long)f + 8) + __n_00;
  return n;
}

Assistant:

static int32 DUMBCALLBACK limit_xm_getnc(char *ptr, int32 n, void *f)
{
	LIMITED_XM *lx = f;
	int left;
	left = lx->allocated - lx->ptr;
	if (n > left) {
		if (left > 0) {
			memcpy( ptr, lx->buffered + lx->ptr, left );
			memset( ptr + left, 0, n - left );
		} else {
			memset( ptr, 0, n );
		}
	} else {
		memcpy( ptr, lx->buffered + lx->ptr, n );
	}
	lx->ptr += n;
	return n;
}